

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void read_frm_crc(FILE *fp,FrmCrc *crc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  if (fp != (FILE *)0x0) {
    uVar1 = __isoc99_fscanf(fp,"%d",crc);
    if ((crc->luma).sum_cnt != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        uVar2 = __isoc99_fscanf(fp,"%lx",(long)(crc->luma).sum + lVar4);
        uVar1 = uVar1 | uVar2;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar5 < (crc->luma).sum_cnt);
    }
    uVar2 = __isoc99_fscanf(fp,"%08x",&(crc->luma).vor);
    uVar3 = __isoc99_fscanf(fp,"%d",&crc->chroma);
    uVar1 = uVar3 | uVar2 | uVar1;
    if ((crc->chroma).sum_cnt != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        uVar2 = __isoc99_fscanf(fp,"%lx",(long)(crc->chroma).sum + lVar4);
        uVar1 = uVar1 | uVar2;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar5 < (crc->chroma).sum_cnt);
    }
    uVar2 = __isoc99_fscanf(fp,"%08x",&(crc->chroma).vor);
    if ((uVar2 | uVar1) == 0xffffffff) {
      _mpp_log_l(2,"utils","unexpected EOF found\n","read_frm_crc");
      return;
    }
  }
  return;
}

Assistant:

void read_frm_crc(FILE *fp, FrmCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        RK_S32 ret = 0;
        // luma
        ret = fscanf(fp, "%d", &crc->luma.len);
        for (loop = 0; loop < crc->luma.sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->luma.sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->luma.vor);

        // chroma
        ret |= fscanf(fp, "%d", &crc->chroma.len);
        for (loop = 0; loop < crc->chroma.sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->chroma.sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->chroma.vor);
        if (ret == EOF)
            mpp_err_f("unexpected EOF found\n");
    }
}